

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O3

QRgbaFloat32 *
fetchIndexedToRGBA32F<(QPixelLayout::BPP)2>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *clut,
          QDitherInfo *param_6)

{
  float *pfVar1;
  uint uVar2;
  uint6 uVar3;
  long lVar4;
  float fVar5;
  
  if (0 < count) {
    lVar4 = 0;
    do {
      uVar2 = (clut->d).ptr[(src[index >> 3] >> (index & 7U) & 1) != 0];
      uVar3 = (uint6)CONCAT14((char)(uVar2 >> 0x18),uVar2) & 0xffff000000ff;
      fVar5 = (float)(ushort)(uVar3 >> 0x20) * 0.003921569;
      pfVar1 = (float *)((long)&buffer->r + lVar4);
      *pfVar1 = (float)(uVar2 >> 0x10 & 0xff) * 0.003921569 * fVar5;
      pfVar1[1] = fVar5 * (float)(uVar2 >> 8 & 0xff) * 0.003921569;
      pfVar1[2] = (float)(int)uVar3 * 0.003921569 * fVar5;
      pfVar1[3] = fVar5;
      index = index + 1;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)count << 4 != lVar4);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchIndexedToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                         const QList<QRgb> *clut, QDitherInfo *)
{
    for (int i = 0; i < count; ++i) {
        const uint s = fetchPixel<BPP>(src, index + i);
        buffer[i] = QRgbaFloat32::fromArgb32(clut->at(s)).premultiplied();
    }
    return buffer;
}